

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall
QWidgetPrivate::render
          (QWidgetPrivate *this,QPaintDevice *target,QPoint *targetOffset,QRegion *sourceRegion,
          RenderFlags renderFlags)

{
  long *plVar1;
  long *plVar2;
  QWExtra *pQVar3;
  long lVar4;
  QPoint QVar5;
  QPaintDevice *pQVar6;
  QWidgetPrivate *this_00;
  bool bVar7;
  char cVar8;
  int iVar9;
  undefined8 uVar10;
  long lVar11;
  uint uVar12;
  QPainter *pQVar13;
  int iVar14;
  int iVar15;
  long in_FS_OFFSET;
  QRegion targetSystemClip;
  QRegion paintRegion;
  long local_68;
  QRegion local_58;
  QRegion local_50;
  QPoint local_48;
  QRegion local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (target == (QPaintDevice *)0x0) {
    render();
    goto LAB_0030263f;
  }
  pQVar3 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if ((pQVar3 == (QWExtra *)0x0) ||
     (local_40.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa,
     (*(ushort *)&pQVar3->field_0x7c & 0x40) == 0)) {
    local_40.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
    prepareToRender((QWidgetPrivate *)&stack0xffffffffffffffc0,(QRegion *)this,
                    (QFlagsStorageHelper<QWidget::RenderFlag,_4>)SUB84(sourceRegion,0));
    cVar8 = QRegion::isEmpty();
    if (cVar8 == '\0') {
      bVar7 = false;
LAB_00302420:
      local_68 = 0;
      goto LAB_00302429;
    }
  }
  else {
    QRegion::QRegion(&stack0xffffffffffffffc0,sourceRegion);
    cVar8 = QRegion::isEmpty();
    if (cVar8 == '\0') {
      lVar11 = *(long *)&this->field_0x8;
      do {
        plVar1 = (long *)(lVar11 + 8);
        lVar4 = *(long *)(*plVar1 + 0x10);
        if (lVar4 == 0) break;
        plVar2 = (long *)(lVar11 + 0x20);
        lVar11 = lVar4;
      } while ((*(uint *)(*plVar2 + 0xc) & 1) == 0);
      lVar11 = *(long *)(*plVar1 + 0x78);
      bVar7 = true;
      if ((lVar11 == 0) || (lVar11 = *(long *)(lVar11 + 8), lVar11 == 0)) goto LAB_00302420;
      local_68 = *(long *)(lVar11 + 0x18);
LAB_00302429:
      iVar9 = (**(code **)(*(long *)target + 0x10))(target);
      if (iVar9 == 1) {
        lVar11 = *(long *)(*(long *)(target + -8) + 0x78);
        if ((lVar11 != 0) && ((*(byte *)(lVar11 + 0x7c) & 0x40) != 0)) {
          lVar11 = *(long *)(*(long *)(target + -8) + 8);
          do {
            plVar1 = (long *)(lVar11 + 8);
            lVar4 = *(long *)(*plVar1 + 0x10);
            if (lVar4 == 0) break;
            plVar2 = (long *)(lVar11 + 0x20);
            lVar11 = lVar4;
          } while ((*(uint *)(*plVar2 + 0xc) & 1) == 0);
          lVar11 = *(long *)(*plVar1 + 0x78);
          if ((((lVar11 != 0) && (lVar11 = *(long *)(lVar11 + 8), lVar11 != 0)) &&
              (pQVar13 = *(QPainter **)(lVar11 + 0x18), pQVar13 != (QPainter *)0x0)) &&
             (cVar8 = QPainter::isActive(), cVar8 != '\0')) {
            setSharedPainter(this,pQVar13);
          }
        }
      }
      QVar5 = *targetOffset;
      uVar10 = QRegion::boundingRect();
      iVar15 = QVar5.xp.m_i.m_i - (int)uVar10;
      iVar14 = QVar5.yp.m_i.m_i - (int)((ulong)uVar10 >> 0x20);
      local_48.xp.m_i = iVar15;
      local_48.yp.m_i = iVar14;
      iVar9 = (**(code **)(*(long *)target + 0x10))(target);
      if (iVar9 == 1) {
        pQVar6 = *(QPaintDevice **)(*(long *)(target + -8) + 0xa8);
        if (pQVar6 != (QPaintDevice *)0x0) {
          uVar10 = *(undefined8 *)(*(long *)(target + -8) + 0x218);
          local_48.xp.m_i = iVar15 - (int)uVar10;
          local_48.yp.m_i = iVar14 - (int)((ulong)uVar10 >> 0x20);
          target = pQVar6;
        }
      }
      if ((!bVar7) && (lVar11 = (**(code **)(*(long *)target + 0x18))(target), lVar11 != 0)) {
        local_50.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
        QPaintEngine::systemClip();
        cVar8 = QRegion::isEmpty();
        if (cVar8 == '\0') {
          QRegion::translated((int)&local_58,(int)&local_50);
          QRegion::operator&=(&stack0xffffffffffffffc0,&local_58);
          QRegion::~QRegion(&local_58);
        }
        QRegion::~QRegion(&local_50);
      }
      uVar12 = 0xe;
      if (((uint)renderFlags.super_QFlagsStorageHelper<QWidget::RenderFlag,_4>.
                 super_QFlagsStorage<QWidget::RenderFlag>.i & 2) == 0) {
        uVar12 = 0x1a;
      }
      lVar11 = *(long *)&this->field_0x8;
      do {
        plVar1 = (long *)(lVar11 + 8);
        lVar4 = *(long *)(*plVar1 + 0x10);
        if (lVar4 == 0) break;
        plVar2 = (long *)(lVar11 + 0x20);
        lVar11 = lVar4;
      } while ((*(uint *)(*plVar2 + 0xc) & 1) == 0);
      lVar11 = *(long *)(*plVar1 + 0x78);
      if ((lVar11 == 0) || (lVar11 = *(long *)(lVar11 + 8), lVar11 == 0)) {
        pQVar13 = (QPainter *)0x0;
      }
      else {
        pQVar13 = *(QPainter **)(lVar11 + 0x18);
      }
      drawWidget(this,target,&stack0xffffffffffffffc0,&local_48,
                 (DrawWidgetFlags)
                 (uVar12 | (uint)renderFlags.super_QFlagsStorageHelper<QWidget::RenderFlag,_4>.
                                 super_QFlagsStorage<QWidget::RenderFlag>.i & 1 | 0x80),pQVar13,
                 (QWidgetRepaintManager *)0x0);
      if (local_68 != 0) {
        lVar11 = *(long *)&this->field_0x8;
        do {
          this_00 = *(QWidgetPrivate **)(lVar11 + 8);
          if (*(long *)&this_00->field_0x10 == 0) break;
          plVar1 = (long *)(lVar11 + 0x20);
          lVar11 = *(long *)&this_00->field_0x10;
        } while ((*(uint *)(*plVar1 + 0xc) & 1) == 0);
        createTLExtra(this_00);
        *(long *)((long)(((this_00->extra)._M_t.
                          super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
                          super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
                          super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
                        super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_> + 0x18) =
             local_68;
      }
    }
  }
  QRegion::~QRegion(&stack0xffffffffffffffc0);
LAB_0030263f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetPrivate::render(QPaintDevice *target, const QPoint &targetOffset,
                            const QRegion &sourceRegion, QWidget::RenderFlags renderFlags)
{
    if (Q_UNLIKELY(!target)) {
        qWarning("QWidget::render: null pointer to paint device");
        return;
    }

    const bool inRenderWithPainter = extra && extra->inRenderWithPainter;
    QRegion paintRegion = !inRenderWithPainter
                          ? prepareToRender(sourceRegion, renderFlags)
                          : sourceRegion;
    if (paintRegion.isEmpty())
        return;

    QPainter *oldSharedPainter = inRenderWithPainter ? sharedPainter() : nullptr;

    // Use the target's shared painter if set (typically set when doing
    // "other->render(widget);" in the widget's paintEvent.
    if (target->devType() == QInternal::Widget) {
        QWidgetPrivate *targetPrivate = static_cast<QWidget *>(target)->d_func();
        if (targetPrivate->extra && targetPrivate->extra->inRenderWithPainter) {
            QPainter *targetPainter = targetPrivate->sharedPainter();
            if (targetPainter && targetPainter->isActive())
                setSharedPainter(targetPainter);
        }
    }

    // Use the target's redirected device if set and adjust offset and paint
    // region accordingly. This is typically the case when people call render
    // from the paintEvent.
    QPoint offset = targetOffset;
    offset -= paintRegion.boundingRect().topLeft();
    QPoint redirectionOffset;
    QPaintDevice *redirected = nullptr;

    if (target->devType() == QInternal::Widget)
        redirected = static_cast<QWidget *>(target)->d_func()->redirected(&redirectionOffset);

    if (redirected) {
        target = redirected;
        offset -= redirectionOffset;
    }

    if (!inRenderWithPainter) { // Clip handled by shared painter (in qpainter.cpp).
        if (QPaintEngine *targetEngine = target->paintEngine()) {
            const QRegion targetSystemClip = targetEngine->systemClip();
            if (!targetSystemClip.isEmpty())
                paintRegion &= targetSystemClip.translated(-offset);
        }
    }

    // Set backingstore flags.
    DrawWidgetFlags flags = DrawPaintOnScreen | DrawInvisible;
    if (renderFlags & QWidget::DrawWindowBackground)
        flags |= DrawAsRoot;

    if (renderFlags & QWidget::DrawChildren)
        flags |= DrawRecursive;
    else
        flags |= DontSubtractOpaqueChildren;

    flags |= DontSetCompositionMode;

    // Render via backingstore.
    drawWidget(target, paintRegion, offset, flags, sharedPainter());

    // Restore shared painter.
    if (oldSharedPainter)
        setSharedPainter(oldSharedPainter);
}